

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

_Bool cf_h2_proxy_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  _Bool _Var2;
  cf_h2_proxy_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if (((pvVar1 == (void *)0x0) || (_Var2 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x10)), _Var2)
      ) && ((pvVar1 == (void *)0x0 ||
            ((*(int *)((long)pvVar1 + 0x130) != 3 ||
             (_Var2 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x98)), _Var2)))))) {
    if (cf->next == (Curl_cfilter *)0x0) {
      _Var2 = false;
    }
    else {
      _Var2 = (*cf->next->cft->has_data_pending)(cf->next,data);
    }
    cf_local._7_1_ = _Var2 != false;
  }
  else {
    cf_local._7_1_ = true;
  }
  return cf_local._7_1_;
}

Assistant:

static bool cf_h2_proxy_data_pending(struct Curl_cfilter *cf,
                                     const struct Curl_easy *data)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  if((ctx && !Curl_bufq_is_empty(&ctx->inbufq)) ||
     (ctx && ctx->tunnel.state == H2_TUNNEL_ESTABLISHED &&
      !Curl_bufq_is_empty(&ctx->tunnel.recvbuf)))
    return TRUE;
  return cf->next? cf->next->cft->has_data_pending(cf->next, data) : FALSE;
}